

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool basist::transcode_uastc_to_pvrtc1_4_rgba
               (uastc_block *pSrc_blocks,void *pDst_blocks,uint32_t num_blocks_x,
               uint32_t num_blocks_y,bool high_quality)

{
  bool bVar1;
  uint *puVar2;
  uint in_ECX;
  uint in_EDX;
  vector<unsigned_int> *in_RDI;
  byte in_R8B;
  pvrtc4_block temp;
  uint32_t i;
  color32 high_color;
  color32 low_color;
  color32 block_pixels [16];
  uint32_t x;
  uint32_t y;
  vector<unsigned_int> temp_endpoints;
  uint32_t height;
  uint32_t width;
  uint32_t in_stack_000002c8;
  uint32_t in_stack_000002cc;
  void *in_stack_000002d0;
  uint32_t *in_stack_000002d8;
  uastc_block *in_stack_000002e0;
  uint32_t in_stack_fffffffffffffef8;
  uint32_t in_stack_fffffffffffffefc;
  vector<unsigned_int> *in_stack_ffffffffffffff00;
  color32 *in_stack_ffffffffffffff08;
  pvrtc4_block *this;
  pvrtc4_block *ppVar3;
  uint32_t uVar4;
  pvrtc4_block *this_00;
  pvrtc4_block local_b4;
  anon_union_4_3_898e29d3_for_color32_0 local_ac;
  anon_union_4_3_898e29d3_for_color32_0 local_a8;
  uint local_a4;
  anon_union_4_3_898e29d3_for_color32_0 local_a0;
  anon_union_4_3_898e29d3_for_color32_0 local_9c;
  undefined4 local_98;
  pvrtc4_block local_88 [2];
  undefined1 in_stack_ffffffffffffff8f;
  color32 *in_stack_ffffffffffffff90;
  uastc_block *in_stack_ffffffffffffff98;
  pvrtc4_block local_48 [3];
  uint32_t local_2c;
  uint32_t local_28;
  byte local_21;
  uint local_20;
  uint local_1c;
  vector<unsigned_int> *local_10;
  byte local_1;
  
  local_21 = in_R8B & 1;
  if ((in_EDX == 0) || (in_ECX == 0)) {
    local_1 = 0;
  }
  else {
    local_28 = in_EDX << 2;
    local_2c = in_ECX << 2;
    local_20 = in_ECX;
    local_1c = in_EDX;
    local_10 = in_RDI;
    bVar1 = basisu::is_pow2(local_28);
    if ((bVar1) && (bVar1 = basisu::is_pow2(local_2c), bVar1)) {
      basisu::vector<unsigned_int>::vector
                (in_stack_ffffffffffffff00,
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      for (local_48[0].m_endpoints = 0; local_48[0].m_endpoints < local_20;
          local_48[0].m_endpoints = local_48[0].m_endpoints + 1) {
        for (local_48[0].m_modulation = 0; local_48[0].m_modulation < local_1c;
            local_48[0].m_modulation = local_48[0].m_modulation + 1) {
          ppVar3 = local_48;
          this_00 = local_88;
          do {
            this = this_00;
            color32::color32((color32 *)this);
            this_00 = (pvrtc4_block *)&this->m_endpoints;
          } while (this_00 != ppVar3);
          bVar1 = unpack_uastc(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                               (bool)in_stack_ffffffffffffff8f);
          if (!bVar1) {
            local_1 = 0;
            local_10 = in_stack_ffffffffffffff00;
            goto LAB_0014575a;
          }
          color32::color32((color32 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                           in_stack_fffffffffffffef8,0,0x1455c9);
          color32::color32((color32 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                           in_stack_fffffffffffffef8,0,0x1455e1);
          for (local_a4 = 0; uVar4 = (uint32_t)((ulong)ppVar3 >> 0x20), local_a4 < 0x10;
              local_a4 = local_a4 + 1) {
            local_a8.field_0 =
                 (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
                 color32::comp_min(in_stack_ffffffffffffff08,(color32 *)in_stack_ffffffffffffff00);
            local_9c.field_0 = local_a8.field_0;
            local_ac.field_0 =
                 (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
                 color32::comp_max(in_stack_ffffffffffffff08,(color32 *)in_stack_ffffffffffffff00);
            local_a0.field_0 = local_ac.field_0;
          }
          pvrtc4_block::pvrtc4_block(&local_b4);
          pvrtc4_block::set_endpoint_floor(this_00,uVar4,(color32 *)this);
          pvrtc4_block::set_endpoint_ceil(this_00,uVar4,(color32 *)this);
          uVar4 = local_b4.m_endpoints;
          puVar2 = basisu::vector<unsigned_int>::operator[]
                             (in_stack_ffffffffffffff00,
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          *puVar2 = uVar4;
        }
      }
      basisu::vector<unsigned_int>::operator[]
                (local_10,CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      fixup_pvrtc1_4_modulation_rgba
                (in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,in_stack_000002cc,
                 in_stack_000002c8);
      local_1 = 1;
LAB_0014575a:
      local_98 = 1;
      basisu::vector<unsigned_int>::~vector(local_10);
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool transcode_uastc_to_pvrtc1_4_rgba(const uastc_block* pSrc_blocks, void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, bool high_quality)
	{
		BASISU_NOTE_UNUSED(high_quality);

		if ((!num_blocks_x) || (!num_blocks_y))
			return false;

		const uint32_t width = num_blocks_x * 4;
		const uint32_t height = num_blocks_y * 4;
		if (!basisu::is_pow2(width) || !basisu::is_pow2(height))
			return false;

		basisu::vector<uint32_t> temp_endpoints(num_blocks_x * num_blocks_y);

		for (uint32_t y = 0; y < num_blocks_y; y++)
		{
			for (uint32_t x = 0; x < num_blocks_x; x++)
			{
				color32 block_pixels[16];
				if (!unpack_uastc(pSrc_blocks[x + y * num_blocks_x], block_pixels, false))
					return false;

				// Get block's RGBA bounding box 
				color32 low_color(255, 255, 255, 255), high_color(0, 0, 0, 0);

				for (uint32_t i = 0; i < 16; i++)
				{
					low_color = color32::comp_min(low_color, block_pixels[i]);
					high_color = color32::comp_max(high_color, block_pixels[i]);
				}

				// Set PVRTC1 endpoints to floor/ceil of bounding box's coordinates.
				pvrtc4_block temp;
				temp.set_endpoint_floor(0, low_color);
				temp.set_endpoint_ceil(1, high_color);

				temp_endpoints[x + y * num_blocks_x] = temp.m_endpoints;
			}
		}

		fixup_pvrtc1_4_modulation_rgba(pSrc_blocks, &temp_endpoints[0], pDst_blocks, num_blocks_x, num_blocks_y);

		return true;
	}